

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void prepare_vertical_filter_coeffs_gamma0_avx2(int delta,int sy,__m256i *coeffs)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 (*in_RDX) [32];
  int in_ESI;
  int in_EDI;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m256i res_0;
  __m128i filt_1;
  __m128i filt_0;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  
  auVar12 = ZEXT116(0) * (undefined1  [16])av1_warped_filter[in_ESI + in_EDI >> 10] +
            ZEXT116(1) * (undefined1  [16])av1_warped_filter[in_ESI >> 10];
  auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
            ZEXT116(1) * (undefined1  [16])av1_warped_filter[in_ESI + in_EDI >> 10];
  uStack_1d0 = auVar13._0_8_;
  uStack_1c8 = auVar13._8_8_;
  auVar11._16_8_ = uStack_1d0;
  auVar11._0_16_ = auVar12;
  auVar11._24_8_ = uStack_1c8;
  auVar10[8] = '\0';
  auVar10[9] = '\x01';
  auVar10[10] = '\x02';
  auVar10[0xb] = '\x03';
  auVar10[0xc] = '\0';
  auVar10[0xd] = '\x01';
  auVar10[0xe] = '\x02';
  auVar10[0xf] = '\x03';
  auVar10[0] = '\0';
  auVar10[1] = '\x01';
  auVar10[2] = '\x02';
  auVar10[3] = '\x03';
  auVar10[4] = '\0';
  auVar10[5] = '\x01';
  auVar10[6] = '\x02';
  auVar10[7] = '\x03';
  auVar10[0x10] = '\0';
  auVar10[0x11] = '\x01';
  auVar10[0x12] = '\x02';
  auVar10[0x13] = '\x03';
  auVar10[0x14] = '\0';
  auVar10[0x15] = '\x01';
  auVar10[0x16] = '\x02';
  auVar10[0x17] = '\x03';
  auVar10[0x18] = '\0';
  auVar10[0x19] = '\x01';
  auVar10[0x1a] = '\x02';
  auVar10[0x1b] = '\x03';
  auVar10[0x1c] = '\0';
  auVar10[0x1d] = '\x01';
  auVar10[0x1e] = '\x02';
  auVar10[0x1f] = '\x03';
  auVar1 = vpshufb_avx2(auVar11,auVar10);
  *in_RDX = auVar1;
  auVar9._16_8_ = uStack_1d0;
  auVar9._0_16_ = auVar12;
  auVar9._24_8_ = uStack_1c8;
  auVar8[8] = '\x04';
  auVar8[9] = '\x05';
  auVar8[10] = '\x06';
  auVar8[0xb] = '\a';
  auVar8[0xc] = '\x04';
  auVar8[0xd] = '\x05';
  auVar8[0xe] = '\x06';
  auVar8[0xf] = '\a';
  auVar8[0] = '\x04';
  auVar8[1] = '\x05';
  auVar8[2] = '\x06';
  auVar8[3] = '\a';
  auVar8[4] = '\x04';
  auVar8[5] = '\x05';
  auVar8[6] = '\x06';
  auVar8[7] = '\a';
  auVar8[0x10] = '\x04';
  auVar8[0x11] = '\x05';
  auVar8[0x12] = '\x06';
  auVar8[0x13] = '\a';
  auVar8[0x14] = '\x04';
  auVar8[0x15] = '\x05';
  auVar8[0x16] = '\x06';
  auVar8[0x17] = '\a';
  auVar8[0x18] = '\x04';
  auVar8[0x19] = '\x05';
  auVar8[0x1a] = '\x06';
  auVar8[0x1b] = '\a';
  auVar8[0x1c] = '\x04';
  auVar8[0x1d] = '\x05';
  auVar8[0x1e] = '\x06';
  auVar8[0x1f] = '\a';
  auVar1 = vpshufb_avx2(auVar9,auVar8);
  in_RDX[1] = auVar1;
  auVar7._16_8_ = uStack_1d0;
  auVar7._0_16_ = auVar12;
  auVar7._24_8_ = uStack_1c8;
  auVar6[8] = '\b';
  auVar6[9] = '\t';
  auVar6[10] = '\n';
  auVar6[0xb] = '\v';
  auVar6[0xc] = '\b';
  auVar6[0xd] = '\t';
  auVar6[0xe] = '\n';
  auVar6[0xf] = '\v';
  auVar6[0] = '\b';
  auVar6[1] = '\t';
  auVar6[2] = '\n';
  auVar6[3] = '\v';
  auVar6[4] = '\b';
  auVar6[5] = '\t';
  auVar6[6] = '\n';
  auVar6[7] = '\v';
  auVar6[0x10] = '\b';
  auVar6[0x11] = '\t';
  auVar6[0x12] = '\n';
  auVar6[0x13] = '\v';
  auVar6[0x14] = '\b';
  auVar6[0x15] = '\t';
  auVar6[0x16] = '\n';
  auVar6[0x17] = '\v';
  auVar6[0x18] = '\b';
  auVar6[0x19] = '\t';
  auVar6[0x1a] = '\n';
  auVar6[0x1b] = '\v';
  auVar6[0x1c] = '\b';
  auVar6[0x1d] = '\t';
  auVar6[0x1e] = '\n';
  auVar6[0x1f] = '\v';
  auVar1 = vpshufb_avx2(auVar7,auVar6);
  in_RDX[2] = auVar1;
  auVar5._16_8_ = uStack_1d0;
  auVar5._0_16_ = auVar12;
  auVar5._24_8_ = uStack_1c8;
  auVar1[8] = '\f';
  auVar1[9] = '\r';
  auVar1[10] = '\x0e';
  auVar1[0xb] = '\x0f';
  auVar1[0xc] = '\f';
  auVar1[0xd] = '\r';
  auVar1[0xe] = '\x0e';
  auVar1[0xf] = '\x0f';
  auVar1[0] = '\f';
  auVar1[1] = '\r';
  auVar1[2] = '\x0e';
  auVar1[3] = '\x0f';
  auVar1[4] = '\f';
  auVar1[5] = '\r';
  auVar1[6] = '\x0e';
  auVar1[7] = '\x0f';
  auVar1[0x10] = '\f';
  auVar1[0x11] = '\r';
  auVar1[0x12] = '\x0e';
  auVar1[0x13] = '\x0f';
  auVar1[0x14] = '\f';
  auVar1[0x15] = '\r';
  auVar1[0x16] = '\x0e';
  auVar1[0x17] = '\x0f';
  auVar1[0x18] = '\f';
  auVar1[0x19] = '\r';
  auVar1[0x1a] = '\x0e';
  auVar1[0x1b] = '\x0f';
  auVar1[0x1c] = '\f';
  auVar1[0x1d] = '\r';
  auVar1[0x1e] = '\x0e';
  auVar1[0x1f] = '\x0f';
  auVar1 = vpshufb_avx2(auVar5,auVar1);
  in_RDX[3] = auVar1;
  uVar2 = *(undefined8 *)(*in_RDX + 8);
  uVar3 = *(undefined8 *)(*in_RDX + 0x10);
  uVar4 = *(undefined8 *)(*in_RDX + 0x18);
  *(undefined8 *)in_RDX[4] = *(undefined8 *)*in_RDX;
  *(undefined8 *)(in_RDX[4] + 8) = uVar2;
  *(undefined8 *)(in_RDX[4] + 0x10) = uVar3;
  *(undefined8 *)(in_RDX[4] + 0x18) = uVar4;
  uVar2 = *(undefined8 *)(in_RDX[1] + 8);
  uVar3 = *(undefined8 *)(in_RDX[1] + 0x10);
  uVar4 = *(undefined8 *)(in_RDX[1] + 0x18);
  *(undefined8 *)in_RDX[5] = *(undefined8 *)in_RDX[1];
  *(undefined8 *)(in_RDX[5] + 8) = uVar2;
  *(undefined8 *)(in_RDX[5] + 0x10) = uVar3;
  *(undefined8 *)(in_RDX[5] + 0x18) = uVar4;
  uVar2 = *(undefined8 *)(in_RDX[2] + 8);
  uVar3 = *(undefined8 *)(in_RDX[2] + 0x10);
  uVar4 = *(undefined8 *)(in_RDX[2] + 0x18);
  *(undefined8 *)in_RDX[6] = *(undefined8 *)in_RDX[2];
  *(undefined8 *)(in_RDX[6] + 8) = uVar2;
  *(undefined8 *)(in_RDX[6] + 0x10) = uVar3;
  *(undefined8 *)(in_RDX[6] + 0x18) = uVar4;
  uVar2 = *(undefined8 *)(in_RDX[3] + 8);
  uVar3 = *(undefined8 *)(in_RDX[3] + 0x10);
  uVar4 = *(undefined8 *)(in_RDX[3] + 0x18);
  *(undefined8 *)in_RDX[7] = *(undefined8 *)in_RDX[3];
  *(undefined8 *)(in_RDX[7] + 8) = uVar2;
  *(undefined8 *)(in_RDX[7] + 0x10) = uVar3;
  *(undefined8 *)(in_RDX[7] + 0x18) = uVar4;
  return;
}

Assistant:

static inline void prepare_vertical_filter_coeffs_gamma0_avx2(int delta, int sy,
                                                              __m256i *coeffs) {
  const __m128i filt_0 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter + (sy >> WARPEDDIFF_PREC_BITS)));
  const __m128i filt_1 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter + ((sy + delta) >> WARPEDDIFF_PREC_BITS)));

  __m256i res_0 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(filt_0), filt_1, 0x1);

  coeffs[0] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_gamma0_mask0_avx2));
  coeffs[1] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_gamma0_mask1_avx2));
  coeffs[2] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_gamma0_mask2_avx2));
  coeffs[3] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_gamma0_mask3_avx2));

  coeffs[4] = coeffs[0];
  coeffs[5] = coeffs[1];
  coeffs[6] = coeffs[2];
  coeffs[7] = coeffs[3];
}